

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

void ucnv_getStarters_63(UConverter *converter,UBool *starters,UErrorCode *err)

{
  UConverterGetStarters UNRECOVERED_JUMPTABLE;
  
  if ((err != (UErrorCode *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    UNRECOVERED_JUMPTABLE = converter->sharedData->impl->getStarters;
    if (UNRECOVERED_JUMPTABLE != (UConverterGetStarters)0x0) {
      (*UNRECOVERED_JUMPTABLE)(converter,starters,err);
      return;
    }
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_getStarters(const UConverter* converter, 
                 UBool starters[256],
                 UErrorCode* err)
{
    if (err == NULL || U_FAILURE(*err)) {
        return;
    }

    if(converter->sharedData->impl->getStarters != NULL) {
        converter->sharedData->impl->getStarters(converter, starters, err);
    } else {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
}